

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O2

void __thiscall
TPZSBMatrix<std::complex<double>_>::AutoFill
          (TPZSBMatrix<std::complex<double>_> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  TPZSBMatrix<std::complex<double>_> *pTVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double __x;
  double __x_00;
  double dVar9;
  double __x_01;
  double __x_02;
  double in_XMM1_Qa;
  complex<double> a;
  complex<double> a_00;
  double local_68;
  double dStack_60;
  long local_58;
  long local_50;
  double local_48 [3];
  
  if (nrow != ncol || symmetric == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzsbndmat.cpp"
               ,0x34);
  }
  lVar6 = nrow + -1;
  if (0x12 < nrow + 9U) {
    lVar6 = nrow / 10;
  }
  this->fBand = lVar6;
  (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(this,nrow,ncol);
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_50 = 1;
  local_58 = 0;
  lVar6 = 0;
  do {
    lVar8 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
    if (lVar8 <= lVar6) {
      return;
    }
    lVar4 = this->fBand;
    __x = 0.0;
    for (lVar7 = 0; lVar1 = local_58, lVar6 != lVar7; lVar7 = lVar7 + 1) {
      (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(this,lVar6,lVar7);
      dVar9 = fabs(__x_00);
      __x = __x + dVar9;
      in_XMM1_Qa = __x;
    }
    lVar4 = lVar4 + local_50;
    if (lVar8 < lVar4) {
      lVar4 = lVar8;
    }
    if (lVar4 <= lVar6) {
      lVar4 = lVar6;
    }
    lVar4 = lVar4 + local_58;
    for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
      TPZMatrix<std::complex<double>_>::GetRandomVal(&this->super_TPZMatrix<std::complex<double>_>);
      local_68 = __x_01;
      dStack_60 = in_XMM1_Qa;
      if (lVar8 == 0) {
        local_68 = fabs(__x_01);
        dStack_60 = 0.0;
      }
      iVar3 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x23])(this,lVar6,lVar6 + lVar8,&local_68);
      if (iVar3 == 0) {
        std::operator<<((ostream *)&std::cout,"AutoFill (TPZMatrix) failed.");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzsbndmat.cpp"
                   ,0x50);
      }
      if (lVar8 != 0) {
        dVar9 = fabs(local_68);
        __x = __x + dVar9;
        in_XMM1_Qa = __x;
      }
    }
    if ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow ==
        (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
      local_48[2] = fabs(__x);
      lVar8 = lVar6;
      pTVar5 = this;
      (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(this,lVar6,lVar6);
      dVar9 = fabs(__x_02);
      if (dVar9 < local_48[2]) {
        local_48[0] = __x + 1.0;
        local_48[1] = 0.0;
        lVar8 = lVar6;
        pTVar5 = this;
        (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(this,lVar6,lVar6,local_48);
      }
      in_XMM1_Qa = 0.0;
      a._M_value._8_8_ = lVar8;
      a._M_value._0_8_ = pTVar5;
      bVar2 = IsZero(a);
      if (bVar2) {
        lVar8 = lVar6;
        pTVar5 = this;
        (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(this,lVar6,lVar6);
        a_00._M_value._8_8_ = lVar8;
        a_00._M_value._0_8_ = pTVar5;
        bVar2 = IsZero(a_00);
        if (bVar2) {
          local_48[0] = 1.0;
          local_48[1] = 0.0;
          (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(this,lVar6,lVar6,local_48);
        }
      }
    }
    lVar6 = lVar6 + 1;
    local_50 = local_50 + 1;
    local_58 = lVar1 + -1;
  } while( true );
}

Assistant:

void TPZSBMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    if (nrow != ncol || symmetric == 0) {
        DebugStop();
    }
    fBand = nrow/10;
    if (fBand == 0) {
        fBand = nrow-1;
    }
    Resize(nrow, ncol);
    
    int64_t i, j;
    TVar val = 0, sum;
    /** Fill data */
    for(i=0;i<this->Rows();i++) {
        sum = 0.0;
        int64_t jmax = i+fBand+1;
        if (jmax >= this->Rows()) {
            jmax = this->Rows();
        }
        for (j=0; j<i; j++) {
            sum += fabs(GetVal(i, j));
        }
        for(j=i;j<jmax;j++) {
            val = this->GetRandomVal();
            if constexpr (is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(!PutVal(i,j,val))
            {
                std::cout << "AutoFill (TPZMatrix) failed.";
                DebugStop();
            }
            if(i!=j) sum += fabs(val);
        }
        if (this->Rows() == this->Cols()) {
            /** Making diagonally dominant and non zero in diagonal */
            if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
                PutVal(i,i,sum+(TVar)1.);
            // To sure diagonal is not zero.
            if(IsZero(sum) && IsZero(GetVal(i,i)))
                PutVal(i,i,1.);
        }
    }
    
}